

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status_or.h
# Opt level: O0

void __thiscall
draco::StatusOr<std::unique_ptr<draco::MeshDecoder,_std::default_delete<draco::MeshDecoder>_>_>::
~StatusOr(StatusOr<std::unique_ptr<draco::MeshDecoder,_std::default_delete<draco::MeshDecoder>_>_>
          *this)

{
  unique_ptr<draco::MeshDecoder,_std::default_delete<draco::MeshDecoder>_> *in_RDI;
  
  std::unique_ptr<draco::MeshDecoder,_std::default_delete<draco::MeshDecoder>_>::~unique_ptr(in_RDI)
  ;
  Status::~Status((Status *)0x14e456);
  return;
}

Assistant:

StatusOr() {}